

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

Bool prvTidySwitchInline(TidyDocImpl *doc,Node *element,Node *node)

{
  Lexer *pLVar1;
  AttVal *pAVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Node *pNVar5;
  int iVar6;
  Bool BVar7;
  IStack *pIVar8;
  IStack tmp_istack;
  IStack *istack2;
  IStack *istack1;
  int i;
  Lexer *lexer;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if (((((pLVar1 == (Lexer *)0x0) || (element == (Node *)0x0)) || (element->tag == (Dict *)0x0)) ||
      ((node == (Node *)0x0 || (node->tag == (Dict *)0x0)))) ||
     ((BVar7 = prvTidyIsPushed(doc,element), BVar7 == no ||
      ((BVar7 = prvTidyIsPushed(doc,node), BVar7 == no ||
       (pLVar1->istacksize - pLVar1->istackbase < 2)))))) {
LAB_00170632:
    doc_local._4_4_ = no;
  }
  else {
    istack1._4_4_ = pLVar1->istacksize - pLVar1->istackbase;
    do {
      do {
        iVar6 = istack1._4_4_;
        istack1._4_4_ = iVar6 + -1;
        if (istack1._4_4_ < 0) goto LAB_00170632;
      } while (pLVar1->istack[istack1._4_4_].tag != element->tag);
      pIVar8 = pLVar1->istack + istack1._4_4_;
      tmp_istack.attributes = (AttVal *)0x0;
      for (istack1._4_4_ = iVar6 + -2; -1 < istack1._4_4_; istack1._4_4_ = istack1._4_4_ + -1) {
        if (pLVar1->istack[istack1._4_4_].tag == node->tag) {
          tmp_istack.attributes = (AttVal *)(pLVar1->istack + istack1._4_4_);
          break;
        }
      }
    } while (tmp_istack.attributes == (AttVal *)0x0);
    pAVar2 = (tmp_istack.attributes)->next;
    pDVar3 = (Dict *)(tmp_istack.attributes)->dict;
    pNVar4 = (tmp_istack.attributes)->asp;
    pNVar5 = (tmp_istack.attributes)->php;
    (tmp_istack.attributes)->next = (AttVal *)pIVar8->next;
    (tmp_istack.attributes)->dict = (Attribute *)pIVar8->tag;
    (tmp_istack.attributes)->asp = (Node *)pIVar8->element;
    (tmp_istack.attributes)->php = (Node *)pIVar8->attributes;
    pIVar8->next = (IStack *)pAVar2;
    pIVar8->tag = pDVar3;
    pIVar8->element = (tmbstr)pNVar4;
    pIVar8->attributes = (AttVal *)pNVar5;
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(SwitchInline)( TidyDocImpl* doc, Node* element, Node* node )
{
    Lexer* lexer = doc->lexer;
    if ( lexer
         && element && element->tag
         && node && node->tag
         && TY_(IsPushed)( doc, element )
         && TY_(IsPushed)( doc, node ) 
         && ((lexer->istacksize - lexer->istackbase) >= 2) )
    {
        /* we have a chance of succeeding ... */
        int i;
        for (i = (lexer->istacksize - lexer->istackbase - 1); i >= 0; --i)
        {
            if (lexer->istack[i].tag == element->tag) {
                /* found the element tag - phew */
                IStack *istack1 = &lexer->istack[i];
                IStack *istack2 = NULL;
                --i; /* back one more, and continue */
                for ( ; i >= 0; --i)
                {
                    if (lexer->istack[i].tag == node->tag)
                    {
                        /* found the element tag - phew */
                        istack2 = &lexer->istack[i];
                        break;
                    }
                }
                if ( istack2 )
                {
                    /* perform the swap */
                    IStack tmp_istack = *istack2;
                    *istack2 = *istack1;
                    *istack1 = tmp_istack;
                    return yes;
                }
            }
        }
    }
    return no;
}